

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcolr.c
# Opt level: O0

FT_Bool get_child_table_pointer
                  (Colr *colr,FT_Byte *paint_base,FT_Byte **p,FT_Byte **child_table_pointer)

{
  uint uVar1;
  FT_Byte *pFVar2;
  FT_Byte *child_table_p;
  FT_UInt32 paint_offset;
  FT_Byte **child_table_pointer_local;
  FT_Byte **p_local;
  FT_Byte *paint_base_local;
  Colr *colr_local;
  
  if (child_table_pointer == (FT_Byte **)0x0) {
    colr_local._7_1_ = '\0';
  }
  else if ((*p < colr->paints_start_v1) ||
          ((FT_Byte *)((long)colr->table + (colr->table_size - 4)) < *p)) {
    colr_local._7_1_ = '\0';
  }
  else {
    *p = *p + 3;
    uVar1 = (uint)(*p)[-3] << 0x10 | (uint)(*p)[-2] << 8 | (uint)(*p)[-1];
    if (uVar1 == 0) {
      colr_local._7_1_ = '\0';
    }
    else {
      pFVar2 = paint_base + uVar1;
      if ((pFVar2 < colr->paints_start_v1) ||
         ((FT_Byte *)((long)colr->table + colr->table_size) <= pFVar2)) {
        colr_local._7_1_ = '\0';
      }
      else {
        *child_table_pointer = pFVar2;
        colr_local._7_1_ = '\x01';
      }
    }
  }
  return colr_local._7_1_;
}

Assistant:

static FT_Bool
  get_child_table_pointer ( Colr*      colr,
                            FT_Byte*   paint_base,
                            FT_Byte**  p,
                            FT_Byte**  child_table_pointer )
  {
    FT_UInt32  paint_offset;
    FT_Byte*   child_table_p;


    if ( !child_table_pointer )
      return 0;

    if ( *p < colr->paints_start_v1                            ||
         *p > (FT_Byte*)colr->table + colr->table_size - 1 - 3 )
      return 0;

    paint_offset = FT_NEXT_UOFF3( *p );
    if ( !paint_offset )
      return 0;

    child_table_p = (FT_Byte*)( paint_base + paint_offset );

    if ( child_table_p < colr->paints_start_v1                         ||
         child_table_p >= ( (FT_Byte*)colr->table + colr->table_size ) )
      return 0;

    *child_table_pointer = child_table_p;
    return 1;
  }